

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

size_t Imf_2_5::bytesPerLineTable
                 (Header *header,vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine
                 )

{
  pointer puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  pointer puVar8;
  int iVar9;
  uint uVar10;
  Box2i *pBVar11;
  ChannelList *this;
  const_iterator cVar12;
  ConstIterator CVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  
  pBVar11 = Header::dataWindow(header);
  this = Header::channels(header);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (bytesPerLine,(long)(((pBVar11->max).y - (pBVar11->min).y) + 1));
  cVar12._M_node = (_Base_ptr)ChannelList::begin(this);
  do {
    CVar13 = ChannelList::end(this);
    if ((const_iterator)cVar12._M_node == CVar13._i._M_node) {
      iVar3 = (pBVar11->min).y;
      iVar4 = (pBVar11->max).y;
      if (iVar4 < iVar3) {
        uVar14 = 0;
      }
      else {
        uVar17 = 0;
        uVar15 = 0;
        do {
          uVar14 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_start[uVar17];
          if (uVar14 < uVar15) {
            uVar14 = uVar15;
          }
          uVar17 = uVar17 + 1;
          uVar15 = uVar14;
        } while ((iVar4 - iVar3) + 1 != uVar17);
      }
      return uVar14;
    }
    iVar9 = pixelTypeSize(cVar12._M_node[9]._M_color);
    uVar2 = (pBVar11->min).y;
    iVar3 = (pBVar11->max).x;
    iVar4 = (pBVar11->min).x;
    iVar5 = *(int *)&cVar12._M_node[9].field_0x4;
    iVar6 = (pBVar11->max).y;
    if ((int)uVar2 <= iVar6) {
      uVar7 = *(uint *)&cVar12._M_node[9]._M_parent;
      puVar8 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar16 = ~(uVar2 + uVar7);
      uVar18 = ~uVar2 + uVar7;
      uVar15 = 0;
      do {
        iVar19 = (int)(uVar2 + uVar15);
        if (iVar19 < 0) {
          if (-1 < (int)uVar7) {
            uVar10 = uVar18 / uVar7;
            goto LAB_001377d5;
          }
          uVar10 = uVar16 / -uVar7;
        }
        else {
          uVar17 = uVar2 + uVar15 & 0xffffffff;
          if ((int)uVar7 < 0) {
            uVar10 = (uint)(uVar17 / -uVar7);
LAB_001377d5:
            uVar10 = -uVar10;
          }
          else {
            uVar10 = (uint)(uVar17 / uVar7);
          }
        }
        if (iVar19 == uVar10 * uVar7) {
          puVar1 = puVar8 + uVar15;
          *puVar1 = *puVar1 + (ulong)((long)((iVar3 - iVar4) + 1) * (long)iVar9) /
                              (ulong)(long)iVar5;
        }
        uVar15 = uVar15 + 1;
        uVar16 = uVar16 - 1;
        uVar18 = uVar18 - 1;
      } while ((iVar6 - uVar2) + 1 != uVar15);
    }
    cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node);
  } while( true );
}

Assistant:

size_t
bytesPerLineTable (const Header &header,
		   vector<size_t> &bytesPerLine)
{
    const Box2i &dataWindow = header.dataWindow();
    const ChannelList &channels = header.channels();

    bytesPerLine.resize (dataWindow.max.y - dataWindow.min.y + 1);

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c)
    {
	size_t nBytes = size_t(pixelTypeSize (c.channel().type)) *
		     size_t(dataWindow.max.x - dataWindow.min.x + 1) /
		     size_t(c.channel().xSampling);

	for (int y = dataWindow.min.y, i = 0; y <= dataWindow.max.y; ++y, ++i)
	    if (modp (y, c.channel().ySampling) == 0)
		bytesPerLine[i] += nBytes;
    }

    size_t maxBytesPerLine = 0;

    for (int y = dataWindow.min.y, i = 0; y <= dataWindow.max.y; ++y, ++i)
	if (maxBytesPerLine < bytesPerLine[i])
	    maxBytesPerLine = bytesPerLine[i];

    return maxBytesPerLine;
}